

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O2

void __thiscall
TextProviderString::TextProviderString
          (TextProviderString *this,shared_ptr<PSLogger> *p_logger,string *p_text)

{
  element_type *peVar1;
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  __shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>);
  TextProvider::TextProvider(&this->super_TextProvider,(shared_ptr<PSLogger> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  (this->super_TextProvider)._vptr_TextProvider = (_func_int **)&PTR__TextProviderString_0015cc60;
  std::__cxx11::string::string((string *)&this->m_text,(string *)p_text);
  (this->m_iterator).
  super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = false;
  if ((this->m_text)._M_string_length == 0) {
    peVar1 = (this->super_TextProvider).m_logger.
             super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string
              (local_48,(string *)&TextProvider::m_parser_text_provider_log_cat_abi_cxx11_);
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,"text provided is empty. Parsing will fail.",&local_69);
    (*peVar1->_vptr_PSLogger[2])(peVar1,4,local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    (this->super_TextProvider).m_has_error = true;
  }
  else {
    (this->super_TextProvider).m_current_char_idx = 0;
  }
  return;
}

Assistant:

TextProviderString::TextProviderString(shared_ptr<PSLogger> p_logger, string p_text)
:TextProvider(p_logger), m_text(p_text)
{
	//todo add some kind of check in case the logger isn't valid

	if(m_text.empty())
	{
		m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat, "text provided is empty. Parsing will fail.");
		m_has_error = true;
	}
	else
	{
		m_current_char_idx = 0;
	}
}